

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
PerformDefaultAction
          (FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this,
          ArgumentTuple *args,string *call_description)

{
  Result RVar1;
  TestExprBuilder<1,_BasicTestExpr<1>_> TVar2;
  OnCallSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this_00;
  Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this_01;
  runtime_error *this_02;
  string message;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)0x0) {
    this_01 = OnCallSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::GetAction
                        (this_00);
    RVar1 = Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::Perform
                      (this_01,args);
    return (Result)RVar1.id_;
  }
  std::operator+(&message,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  if (DefaultValue<TestExprBuilder<1,BasicTestExpr<1>>>::value_ != 0) {
    TVar2 = DefaultValue<TestExprBuilder<1,_BasicTestExpr<1>_>_>::Get();
    std::__cxx11::string::~string((string *)&message);
    return (Result)TVar2.id_;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,(string *)&message);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }